

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkPrintStrSupports(Abc_Ntk_t *pNtk,int fMatrix)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int local_38;
  int nPis;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vSupp;
  Abc_Ntk_t *pAStack_10;
  int fMatrix_local;
  Abc_Ntk_t *pNtk_local;
  
  vSupp._4_4_ = fMatrix;
  pAStack_10 = pNtk;
  printf("Structural support info:\n");
  for (nPis = 0; iVar1 = Abc_NtkCoNum(pAStack_10), nPis < iVar1; nPis = nPis + 1) {
    _k = Abc_NtkCo(pAStack_10,nPis);
    vNodes = Abc_NtkNodeSupport(pAStack_10,(Abc_Obj_t **)&k,1);
    pObj = (Abc_Obj_t *)Abc_NtkDfsNodes(pAStack_10,(Abc_Obj_t **)&k,1);
    uVar2 = Abc_NtkCountPis(vNodes);
    pcVar3 = Abc_ObjName(_k);
    printf("%5d  %20s :  Cone = %5d.  Supp = %5d. (PIs = %5d. FFs = %5d.)\n",(ulong)(uint)nPis,
           pcVar3,(ulong)*(uint *)((long)&pObj->pNtk + 4),(ulong)(uint)vNodes->nSize,(ulong)uVar2,
           vNodes->nSize - uVar2);
    Vec_PtrFree((Vec_Ptr_t *)pObj);
    Vec_PtrFree(vNodes);
  }
  if (vSupp._4_4_ == 0) {
    Abc_NtkCleanMarkA(pAStack_10);
  }
  else {
    for (local_38 = 0; iVar1 = Abc_NtkCiNum(pAStack_10), local_38 < iVar1; local_38 = local_38 + 1)
    {
      _k = Abc_NtkCi(pAStack_10,local_38);
      *(uint *)&_k->field_0x14 = *(uint *)&_k->field_0x14 & 0xffffffef;
    }
    printf("Actual support info:\n");
    for (nPis = 0; iVar1 = Abc_NtkCoNum(pAStack_10), nPis < iVar1; nPis = nPis + 1) {
      _k = Abc_NtkCo(pAStack_10,nPis);
      vNodes = Abc_NtkNodeSupport(pAStack_10,(Abc_Obj_t **)&k,1);
      for (local_38 = 0; iVar1 = Vec_PtrSize(vNodes), local_38 < iVar1; local_38 = local_38 + 1) {
        _k = (Abc_Obj_t *)Vec_PtrEntry(vNodes,local_38);
        *(uint *)&_k->field_0x14 = *(uint *)&_k->field_0x14 & 0xffffffef | 0x10;
      }
      Vec_PtrFree(vNodes);
      for (local_38 = 0; iVar1 = Abc_NtkCiNum(pAStack_10), local_38 < iVar1; local_38 = local_38 + 1
          ) {
        _k = Abc_NtkCi(pAStack_10,local_38);
        printf("%d",(ulong)(*(uint *)&_k->field_0x14 >> 4 & 1));
      }
      printf("\n");
      for (local_38 = 0; iVar1 = Abc_NtkCiNum(pAStack_10), local_38 < iVar1; local_38 = local_38 + 1
          ) {
        _k = Abc_NtkCi(pAStack_10,local_38);
        *(uint *)&_k->field_0x14 = *(uint *)&_k->field_0x14 & 0xffffffef;
      }
    }
    Abc_NtkCleanMarkA(pAStack_10);
  }
  return;
}

Assistant:

void Abc_NtkPrintStrSupports( Abc_Ntk_t * pNtk, int fMatrix )
{
    Vec_Ptr_t * vSupp, * vNodes;
    Abc_Obj_t * pObj;
    int i, k, nPis;
    printf( "Structural support info:\n" );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vSupp  = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        vNodes = Abc_NtkDfsNodes( pNtk, &pObj, 1 );
        nPis   = Abc_NtkCountPis( vSupp );
        printf( "%5d  %20s :  Cone = %5d.  Supp = %5d. (PIs = %5d. FFs = %5d.)\n",
            i, Abc_ObjName(pObj), vNodes->nSize, vSupp->nSize, nPis, vSupp->nSize - nPis );
        Vec_PtrFree( vNodes );
        Vec_PtrFree( vSupp );
    }
    if ( !fMatrix )
    {
        Abc_NtkCleanMarkA( pNtk );
        return;
    }

    Abc_NtkForEachCi( pNtk, pObj, k )
        pObj->fMarkA = 0;

    printf( "Actual support info:\n" );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vSupp  = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, k )
            pObj->fMarkA = 1;
        Vec_PtrFree( vSupp );

        Abc_NtkForEachCi( pNtk, pObj, k )
            printf( "%d", pObj->fMarkA );
        printf( "\n" );

        Abc_NtkForEachCi( pNtk, pObj, k )
            pObj->fMarkA = 0;
    }
    Abc_NtkCleanMarkA( pNtk );
}